

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool IsAfter(VmInstruction *a,VmInstruction *b)

{
  VmInstruction *local_20;
  VmInstruction *b_local;
  VmInstruction *a_local;
  
  local_20 = b;
  if (a->parent != b->parent) {
    __assert_fail("a->parent == b->parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1b8c,"bool IsAfter(VmInstruction *, VmInstruction *)");
  }
  while( true ) {
    if (local_20 == (VmInstruction *)0x0) {
      return false;
    }
    if (a == local_20) break;
    local_20 = local_20->nextSibling;
  }
  return true;
}

Assistant:

bool IsAfter(VmInstruction *a, VmInstruction *b)
{
	assert(a->parent == b->parent);

	while(b)
	{
		if(a == b)
			return true;

		b = b->nextSibling;
	}

	return false;
}